

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O2

void __thiscall VRle::Data::translate(Data *this,VPoint *p)

{
  undefined2 uVar1;
  undefined2 uVar2;
  pointer pSVar3;
  Span *i;
  pointer pSVar4;
  VPoint VVar5;
  vector<VRle::Span,_std::allocator<VRle::Span>_> *__range1;
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = (*p).mx - (this->mOffset).mx;
  auVar6._4_4_ = (*p).my - (this->mOffset).my;
  auVar6._8_8_ = 0;
  VVar5.my = auVar6._4_4_;
  VVar5.mx = auVar6._0_4_;
  this->mOffset = VVar5;
  pSVar4 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar3 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
           super__Vector_impl_data._M_finish;
  auVar6 = pshuflw(auVar6,auVar6,0xe8);
  for (; pSVar4 != pSVar3; pSVar4 = pSVar4 + 1) {
    uVar1 = pSVar4->x;
    uVar2 = pSVar4->y;
    pSVar4->x = uVar1 + auVar6._0_2_;
    pSVar4->y = uVar2 + auVar6._2_2_;
  }
  updateBbox(this);
  VRect::translate(&this->mBbox,(this->mOffset).mx,(this->mOffset).my);
  return;
}

Assistant:

void VRle::Data::translate(const VPoint &p)
{
    // take care of last offset if applied
    mOffset = p - mOffset;
    int x = mOffset.x();
    int y = mOffset.y();
    for (auto &i : mSpans) {
        i.x = i.x + x;
        i.y = i.y + y;
    }
    updateBbox();
    mBbox.translate(mOffset.x(), mOffset.y());
}